

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib564.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  timeval tVar10;
  int running;
  fd_set wr;
  fd_set rd;
  fd_set exc;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar7 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib564.c"
                  ,0x29,iVar1,uVar2);
    goto LAB_0010244d;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar9 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib564.c"
                  ,0x2b);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar7 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x29,1);
      uVar7 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x2714,libtest_arg2);
        uVar7 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar3,0x65,4);
          uVar7 = _stderr;
          if (iVar1 == 0) {
            lVar9 = curl_multi_init();
            if (lVar9 == 0) {
              lVar9 = 0;
              curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib564.c"
                            ,0x32);
              iVar1 = 0x7b;
              goto LAB_00102438;
            }
            iVar1 = curl_multi_add_handle(lVar9,lVar3);
            uVar7 = _stderr;
            if (iVar1 == 0) {
              curl_mfprintf(_stderr,"Start at URL 0\n");
              local_1d0 = -99;
              local_1c8.tv_sec = 1;
              local_1c8.tv_usec = 0;
              iVar1 = curl_multi_perform(lVar9,&local_1cc);
              if (iVar1 == 0) {
                do {
                  if (local_1cc < 0) {
                    pcVar8 = 
                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                    ;
                    uVar7 = 0x40;
LAB_0010276c:
                    curl_mfprintf(_stderr,pcVar8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib564.c"
                                  ,uVar7);
                    iVar1 = 0x7a;
                    goto LAB_00102438;
                  }
                  tVar10 = tutil_tvnow();
                  lVar4 = tutil_tvdiff(tVar10,tv_test_start);
                  if (60000 < lVar4) {
                    uVar7 = 0x42;
LAB_001027d3:
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib564.c"
                                  ,uVar7);
                    iVar1 = 0x7d;
                    goto LAB_00102438;
                  }
                  if (local_1cc == 0) {
                    iVar1 = 0;
                    goto LAB_00102438;
                  }
                  local_138.__fds_bits[0xe] = 0;
                  local_138.__fds_bits[0xf] = 0;
                  local_138.__fds_bits[0xc] = 0;
                  local_138.__fds_bits[0xd] = 0;
                  local_138.__fds_bits[10] = 0;
                  local_138.__fds_bits[0xb] = 0;
                  local_138.__fds_bits[8] = 0;
                  local_138.__fds_bits[9] = 0;
                  local_138.__fds_bits[6] = 0;
                  local_138.__fds_bits[7] = 0;
                  local_138.__fds_bits[4] = 0;
                  local_138.__fds_bits[5] = 0;
                  local_138.__fds_bits[2] = 0;
                  local_138.__fds_bits[3] = 0;
                  local_138.__fds_bits[0] = 0;
                  local_138.__fds_bits[1] = 0;
                  local_1b8.__fds_bits[0] = 0;
                  local_1b8.__fds_bits[1] = 0;
                  local_1b8.__fds_bits[2] = 0;
                  local_1b8.__fds_bits[3] = 0;
                  local_1b8.__fds_bits[4] = 0;
                  local_1b8.__fds_bits[5] = 0;
                  local_1b8.__fds_bits[6] = 0;
                  local_1b8.__fds_bits[7] = 0;
                  local_1b8.__fds_bits[8] = 0;
                  local_1b8.__fds_bits[9] = 0;
                  local_1b8.__fds_bits[10] = 0;
                  local_1b8.__fds_bits[0xb] = 0;
                  local_1b8.__fds_bits[0xc] = 0;
                  local_1b8.__fds_bits[0xd] = 0;
                  local_1b8.__fds_bits[0xe] = 0;
                  local_1b8.__fds_bits[0xf] = 0;
                  local_b8.__fds_bits[0] = 0;
                  local_b8.__fds_bits[1] = 0;
                  local_b8.__fds_bits[2] = 0;
                  local_b8.__fds_bits[3] = 0;
                  local_b8.__fds_bits[4] = 0;
                  local_b8.__fds_bits[5] = 0;
                  local_b8.__fds_bits[6] = 0;
                  local_b8.__fds_bits[7] = 0;
                  local_b8.__fds_bits[8] = 0;
                  local_b8.__fds_bits[9] = 0;
                  local_b8.__fds_bits[10] = 0;
                  local_b8.__fds_bits[0xb] = 0;
                  local_b8.__fds_bits[0xc] = 0;
                  local_b8.__fds_bits[0xd] = 0;
                  local_b8.__fds_bits[0xe] = 0;
                  local_b8.__fds_bits[0xf] = 0;
                  iVar1 = curl_multi_fdset(lVar9,&local_138,&local_1b8,&local_b8,&local_1d0);
                  uVar7 = _stderr;
                  if (iVar1 != 0) {
                    uVar2 = curl_multi_strerror(iVar1);
                    pcVar8 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
                    uVar6 = 0x4b;
                    goto LAB_0010242b;
                  }
                  if (local_1d0 < -1) {
                    pcVar8 = 
                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
                    uVar7 = 0x4b;
                    goto LAB_0010276c;
                  }
                  iVar1 = select_wrapper(local_1d0 + 1,&local_138,&local_1b8,&local_b8,&local_1c8);
                  if (iVar1 == -1) {
                    piVar5 = __errno_location();
                    uVar7 = _stderr;
                    iVar1 = *piVar5;
                    pcVar8 = strerror(iVar1);
                    curl_mfprintf(uVar7,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib564.c"
                                  ,0x4f,iVar1,pcVar8);
                    iVar1 = 0x79;
                    goto LAB_00102438;
                  }
                  tVar10 = tutil_tvnow();
                  lVar4 = tutil_tvdiff(tVar10,tv_test_start);
                  if (60000 < lVar4) {
                    uVar7 = 0x51;
                    goto LAB_001027d3;
                  }
                  local_1d0 = -99;
                  local_1c8.tv_sec = 1;
                  local_1c8.tv_usec = 0;
                  iVar1 = curl_multi_perform(lVar9,&local_1cc);
                } while (iVar1 == 0);
              }
              uVar7 = _stderr;
              uVar2 = curl_multi_strerror(iVar1);
              pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
              uVar6 = 0x40;
            }
            else {
              uVar2 = curl_multi_strerror(iVar1);
              pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
              uVar6 = 0x34;
            }
          }
          else {
            uVar2 = curl_easy_strerror(iVar1);
            pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            lVar9 = 0;
            uVar6 = 0x30;
          }
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          lVar9 = 0;
          uVar6 = 0x2f;
        }
      }
      else {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        lVar9 = 0;
        uVar6 = 0x2e;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar9 = 0;
      uVar6 = 0x2d;
    }
LAB_0010242b:
    curl_mfprintf(uVar7,pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib564.c"
                  ,uVar6,iVar1,uVar2);
  }
LAB_00102438:
  curl_easy_cleanup(lVar3);
  curl_multi_cleanup(lVar9);
  curl_global_cleanup();
LAB_0010244d:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  int running;
  CURLM *m = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_PROXY, libtest_arg2);
  easy_setopt(curl, CURLOPT_PROXYTYPE, (long)CURLPROXY_SOCKS4);

  multi_init(m);

  multi_add_handle(m, curl);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}